

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

int SaveEXR(Vector *img,int w,int h,string *filename)

{
  double dVar1;
  int iVar2;
  reference pvVar3;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int ret;
  char *err;
  int i_1;
  float *image_ptr [3];
  int i;
  vector<float,_std::allocator<float>_> images [3];
  char *names [3];
  EXRImage image;
  size_type in_stack_ffffffffffffee48;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffee50;
  vector<float,_std::allocator<float>_> *pvVar4;
  char **in_stack_ffffffffffffee58;
  vector<float,_std::allocator<float>_> *pvVar5;
  char *in_stack_ffffffffffffee60;
  vector<float,_std::allocator<float>_> *this;
  undefined4 in_stack_ffffffffffffee68;
  undefined4 in_stack_ffffffffffffee6c;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffee70;
  vector<float,_std::allocator<float>_> *local_1148;
  undefined8 local_1138;
  int local_112c;
  reference local_1128;
  reference local_1120;
  reference local_1118;
  int local_1108;
  vector<float,_std::allocator<float>_> local_10f8;
  vector<float,_std::allocator<float>_> local_10e0;
  vector<float,_std::allocator<float>_> local_10c8;
  vector<float,_std::allocator<float>_> vStack_10b0;
  char *local_1098;
  EXRImage local_1088;
  int local_18;
  int local_14;
  long local_10;
  int local_4;
  
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  InitEXRImage(&local_1088);
  local_1088.num_channels = 3;
  vStack_10b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x148fcb;
  vStack_10b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x148fc9;
  local_1098 = "R";
  local_1148 = &local_10f8;
  do {
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x12eb92);
    local_1148 = local_1148 + 1;
  } while (local_1148 != &vStack_10b0);
  std::vector<float,_std::allocator<float>_>::resize
            (in_stack_ffffffffffffee70,CONCAT44(in_stack_ffffffffffffee6c,in_stack_ffffffffffffee68)
            );
  std::vector<float,_std::allocator<float>_>::resize
            (in_stack_ffffffffffffee70,CONCAT44(in_stack_ffffffffffffee6c,in_stack_ffffffffffffee68)
            );
  std::vector<float,_std::allocator<float>_>::resize
            (in_stack_ffffffffffffee70,CONCAT44(in_stack_ffffffffffffee6c,in_stack_ffffffffffffee68)
            );
  for (local_1108 = 0; local_1108 < local_14 * local_18; local_1108 = local_1108 + 1) {
    dVar1 = *(double *)(local_10 + (long)local_1108 * 0x18);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_10f8,(long)local_1108);
    *pvVar3 = (float)dVar1;
    dVar1 = *(double *)(local_10 + (long)local_1108 * 0x18 + 8);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_10e0,(long)local_1108);
    *pvVar3 = (float)dVar1;
    dVar1 = *(double *)(local_10 + (long)local_1108 * 0x18 + 0x10);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_10c8,(long)local_1108);
    *pvVar3 = (float)dVar1;
  }
  local_1128 = std::vector<float,_std::allocator<float>_>::at
                         (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  local_1120 = std::vector<float,_std::allocator<float>_>::at
                         (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  local_1118 = std::vector<float,_std::allocator<float>_>::at
                         (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  local_1088.channel_names =
       (char **)&vStack_10b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
  local_1088.images = (uchar **)&local_1128;
  local_1088.width = local_14;
  local_1088.height = local_18;
  local_1088.compression = 3;
  local_1088.pixel_types = (int *)malloc((long)local_1088.num_channels << 2);
  local_1088.requested_pixel_types = (int *)malloc((long)local_1088.num_channels << 2);
  for (local_112c = 0; local_112c < local_1088.num_channels; local_112c = local_112c + 1) {
    local_1088.pixel_types[local_112c] = 2;
    local_1088.requested_pixel_types[local_112c] = 1;
  }
  std::__cxx11::string::c_str();
  iVar2 = SaveMultiChannelEXRToFile
                    ((EXRImage *)CONCAT44(in_stack_ffffffffffffee6c,in_stack_ffffffffffffee68),
                     in_stack_ffffffffffffee60,in_stack_ffffffffffffee58);
  if (iVar2 != 0) {
    fprintf(_stderr,"Save EXR err: %s\n",local_1138);
  }
  free(local_1088.pixel_types);
  free(local_1088.requested_pixel_types);
  pvVar5 = &local_10f8;
  this = &vStack_10b0;
  local_4 = iVar2;
  do {
    pvVar4 = this + -1;
    std::vector<float,_std::allocator<float>_>::~vector(this);
    this = pvVar4;
  } while (pvVar4 != pvVar5);
  return local_4;
}

Assistant:

int SaveEXR(const Vector* img, int w, int h, const std::string& filename) {
   EXRImage image;
   InitEXRImage(&image);
   image.num_channels  = 3;
   const char* names[] = {"B", "G", "R"};

    std::vector<float> images[3];
    images[0].resize(w * h);
    images[1].resize(w * h);
    images[2].resize(w * h);

    for (int i = 0; i < w * h; i++) {
      images[0][i] = img[i].x;
      images[1][i] = img[i].y;
      images[2][i] = img[i].z;
    }

    float* image_ptr[3];
    image_ptr[0] = &(images[2].at(0)); // B
    image_ptr[1] = &(images[1].at(0)); // G
    image_ptr[2] = &(images[0].at(0)); // R

    image.channel_names = names;
    image.images = (unsigned char**)image_ptr;
    image.width = w;
    image.height = h;
    image.compression = TINYEXR_COMPRESSIONTYPE_ZIP;

    image.pixel_types = (int *)malloc(sizeof(int) * image.num_channels);
    image.requested_pixel_types = (int *)malloc(sizeof(int) * image.num_channels);
    for (int i = 0; i < image.num_channels; i++) {
      image.pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT; // pixel type of input image
      image.requested_pixel_types[i] = TINYEXR_PIXELTYPE_HALF; // pixel type of output image to be stored in .EXR
    }

    const char* err;
    int ret = SaveMultiChannelEXRToFile(&image, filename.c_str(), &err);
    if (ret != 0) {
      fprintf(stderr, "Save EXR err: %s\n", err);
    }

    free(image.pixel_types);
    free(image.requested_pixel_types);
    return ret;
}